

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O2

Entity __thiscall entityx::EntityManager::create(EntityManager *this)

{
  uint index;
  long lVar1;
  Entity EVar2;
  ulong uVar3;
  ulong uVar4;
  Entity entity;
  Entity local_28;
  
  lVar1 = *(long *)(this + 0x80);
  if (*(long *)(this + 0x78) == lVar1) {
    index = *(uint *)(this + 8);
    uVar4 = (ulong)index;
    *(uint *)(this + 8) = index + 1;
    accomodate_entity(this,index);
    *(undefined4 *)(*(long *)(this + 0x60) + uVar4 * 4) = 1;
    uVar3 = 0x100000000;
  }
  else {
    uVar4 = (ulong)*(uint *)(lVar1 + -4);
    *(long *)(this + 0x80) = lVar1 + -4;
    uVar3 = (ulong)*(uint *)(*(long *)(this + 0x60) + uVar4 * 4) << 0x20;
  }
  local_28.id_.id_ = uVar4 | uVar3;
  local_28.manager_ = this;
  EventManager::emit<entityx::EntityCreatedEvent,entityx::Entity&>
            (*(EventManager **)(this + 0x10),&local_28);
  EVar2.id_.id_ = local_28.id_.id_;
  EVar2.manager_ = local_28.manager_;
  return EVar2;
}

Assistant:

Entity create() {
    uint32_t index, version;
    if (free_list_.empty()) {
      index = index_counter_++;
      accomodate_entity(index);
      version = entity_version_[index] = 1;
    } else {
      index = free_list_.back();
      free_list_.pop_back();
       version = entity_version_[index];
    }
    Entity entity(this, Entity::Id(index, version));
    event_manager_.emit<EntityCreatedEvent>(entity);
    return entity;
  }